

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

int share_channel_server_cmp(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(uint *)((long)bv + 8) <= *(uint *)((long)av + 8)) {
    uVar1 = (uint)(*(uint *)((long)bv + 8) < *(uint *)((long)av + 8));
  }
  return uVar1;
}

Assistant:

static int share_channel_server_cmp(void *av, void *bv)
{
    const struct share_channel *a = (const struct share_channel *)av;
    const struct share_channel *b = (const struct share_channel *)bv;

    if (a->server_id < b->server_id)
        return -1;
    else if (a->server_id > b->server_id)
        return +1;
    else
        return 0;
}